

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O0

bool __thiscall MP1Node::recvCallBack(MP1Node *this,void *env,char *data,int size)

{
  int iVar1;
  MsgTypes msgType;
  MessageHdr *messageHdr;
  int size_local;
  char *data_local;
  void *env_local;
  MP1Node *this_local;
  
  if (size < 4) {
    Log::LOG(this->log,&this->memberNode->addr,
             "Message received with size less than MessageHdr. Ignored.");
    this_local._7_1_ = false;
  }
  else {
    iVar1 = *(int *)data;
    if (iVar1 == 0) {
      this_local._7_1_ = joinReqHandler(this,env,data + 4,size + -4);
    }
    else if (iVar1 == 1) {
      this_local._7_1_ = joinRepHandler(this,env,data + 4,size + -4);
    }
    else if (iVar1 == 2) {
      this_local._7_1_ = heartbeatReqHandler(this,env,data + 4,size + -4);
    }
    else if (iVar1 == 3) {
      this_local._7_1_ = heartbeatRepHandler(this,env,data + 4,size + -4);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MP1Node::recvCallBack(void *env, char *data, int size ) {
    /*
     * Your code goes here
     */
    if (size < (int)sizeof(MessageHdr)) {
#ifdef DEBUGLOG
        log->LOG(&memberNode->addr, "Message received with size less than MessageHdr. Ignored.");
#endif
        return false;
    }

    MessageHdr* messageHdr = (MessageHdr*) data;
    MsgTypes msgType = messageHdr->msgType;

    if (msgType == JOINREQ) {
        return joinReqHandler(env, data+sizeof(MessageHdr), size - sizeof(MessageHdr)); //no need for the msgType anymore, so move address right
    } else if (msgType == JOINREP) {
        return joinRepHandler(env, data + sizeof(MessageHdr), size - sizeof(MessageHdr)); //no need for the msgType anymore, so move address right
    } else if (msgType == HEARTBEATREQ) {
        return heartbeatReqHandler(env, data + sizeof(MessageHdr), size - sizeof(MessageHdr));
    } else if (msgType == HEARTBEATREP){
        return heartbeatRepHandler(env, data + sizeof(MessageHdr), size - sizeof(MessageHdr));
    } else {
        return false;
    }
}